

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O2

void do_dungeon(char *infile,char *outfile)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  char *s;
  
  ifp = (FILE *)fopen(infile,"r");
  pcVar3 = infile;
  if (((FILE *)ifp != (FILE *)0x0) &&
     (ofp = (FILE *)fopen(outfile,"w+"), pcVar3 = outfile, (FILE *)ofp != (FILE *)0x0)) {
    fputs("#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",(FILE *)ofp);
    uVar5 = 0;
LAB_00109d09:
    do {
      do {
        s = in_line;
        pcVar3 = fgets(in_line,0x100,(FILE *)ifp);
        if (pcVar3 == (char *)0x0) {
          fclose((FILE *)ifp);
          fclose((FILE *)ofp);
          return;
        }
        uVar5 = uVar5 + 1;
      } while (in_line[0] == '#');
      while (in_line[0] == '%') {
        uVar1 = check_control(s);
        if ((int)uVar1 < 0) {
          fprintf(_stderr,"Unknown control option \'%s\' in file %s at line %d.\n",in_line,infile,
                  (ulong)uVar5);
          goto LAB_00109dde;
        }
        if (uVar1 != 1) {
          sVar4 = strlen(deflist[uVar1].defname);
          pcVar3 = in_line + sVar4 + 1;
          goto LAB_00109d86;
        }
        do {
          s = in_line;
          pcVar3 = fgets(in_line,0x100,(FILE *)ifp);
          if (pcVar3 == (char *)0x0) goto LAB_00109d09;
          iVar2 = check_control(s);
        } while (iVar2 == 1);
      }
      pcVar3 = in_line;
LAB_00109d86:
      fputs(pcVar3,(FILE *)ofp);
    } while( true );
  }
  perror(pcVar3);
LAB_00109dde:
  exit(1);
}

Assistant:

void do_dungeon(const char *infile, const char *outfile)
{
	int rcnt = 0;

	if (!(ifp = fopen(infile, RDTMODE))) {
		perror(infile);
		exit(EXIT_FAILURE);
	}
	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	
	fprintf(ofp, "%s", Dont_Edit_Data);

	while (fgets(in_line, sizeof in_line, ifp) != 0) {
	    rcnt++;
	    if (in_line[0] == '#') continue;	/* discard comments */
recheck:
	    if (in_line[0] == '%') {
		int i = check_control(in_line);
		if (i >= 0) {
		    if (!deflist[i].true_or_false)  {
			while (fgets(in_line, sizeof in_line, ifp) != 0)
			    if (check_control(in_line) != i) goto recheck;
		    } else
			fputs(without_control(in_line),ofp);
		} else {
		    fprintf(stderr, "Unknown control option '%s' in file %s at line %d.\n",
			    in_line, infile, rcnt);
		    exit(EXIT_FAILURE);
		}
	    } else
		fputs(in_line,ofp);
	}
	fclose(ifp);
	fclose(ofp);

	return;
}